

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

void d68020_divl(void)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  uint extension;
  
  if ((g_cpu_type & 0x1c) == 0) {
    if ((g_cpu_ir & 0xf000) == 0xf000) {
      d68000_1111();
    }
    else {
      d68000_illegal();
    }
  }
  else {
    uVar1 = dasm_read_imm_16(2);
    if ((uVar1 & 0x400) == 0) {
      if ((uVar1 & 7) == (uVar1 >> 0xc & 7)) {
        uVar2 = 0x75;
        if ((uVar1 & 0x800) != 0) {
          uVar2 = 0x73;
        }
        pcVar3 = get_ea_mode_str(g_cpu_ir,2);
        sprintf(g_dasm_str,"div%c.l  %s, D%d; (2+)",(ulong)uVar2,pcVar3,(ulong)(uVar1 >> 0xc & 7));
      }
      else {
        uVar2 = 0x75;
        if ((uVar1 & 0x800) != 0) {
          uVar2 = 0x73;
        }
        pcVar3 = get_ea_mode_str(g_cpu_ir,2);
        sprintf(g_dasm_str,"div%cl.l %s, D%d:D%d; (2+)",(ulong)uVar2,pcVar3,(ulong)(uVar1 & 7),
                (ulong)(uVar1 >> 0xc & 7));
      }
    }
    else {
      uVar2 = 0x75;
      if ((uVar1 & 0x800) != 0) {
        uVar2 = 0x73;
      }
      pcVar3 = get_ea_mode_str(g_cpu_ir,2);
      sprintf(g_dasm_str,"div%c.l  %s, D%d:D%d; (2+)",(ulong)uVar2,pcVar3,(ulong)(uVar1 & 7),
              (ulong)(uVar1 >> 0xc & 7));
    }
  }
  return;
}

Assistant:

static void d68020_divl(void)
{
	uint extension;
	LIMIT_CPU_TYPES(M68020_PLUS);
	extension = read_imm_16();

	if(BIT_A(extension))
		sprintf(g_dasm_str, "div%c.l  %s, D%d:D%d; (2+)", BIT_B(extension) ? 's' : 'u', get_ea_mode_str_32(g_cpu_ir), extension&7, (extension>>12)&7);
	else if((extension&7) == ((extension>>12)&7))
		sprintf(g_dasm_str, "div%c.l  %s, D%d; (2+)", BIT_B(extension) ? 's' : 'u', get_ea_mode_str_32(g_cpu_ir), (extension>>12)&7);
	else
		sprintf(g_dasm_str, "div%cl.l %s, D%d:D%d; (2+)", BIT_B(extension) ? 's' : 'u', get_ea_mode_str_32(g_cpu_ir), extension&7, (extension>>12)&7);
}